

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O3

double __thiscall chrono::ChSolverAPGD::Res4(ChSolverAPGD *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<> *pCVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  char *__function;
  ActualDstType actualDst;
  ulong uVar8;
  ulong uVar9;
  Index index_1;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  scalar_sum_op<double,_double> local_69;
  undefined1 local_68 [16];
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_50;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_40;
  
  iVar2 = this->nc;
  pCVar1 = &this->tmp;
  (*sysd->_vptr_ChSystemDescriptor[0x16])(sysd,pCVar1,&this->gammaNew,0);
  uVar3 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (uVar3 == (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows) {
    if ((long)uVar3 < 0) {
LAB_007bef02:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows == uVar3) {
      pdVar4 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pdVar5 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar6 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar8 = uVar3 & 0x7ffffffffffffff8;
      local_68._0_8_ = 1.0 / (double)(iVar2 * iVar2);
      local_68._8_8_ = 0;
      if (7 < uVar3) {
        auVar10 = vbroadcastsd_avx512f(local_68);
        uVar9 = 0;
        do {
          auVar11 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar6 + uVar9),
                                   *(undefined1 (*) [64])(pdVar5 + uVar9));
          auVar11 = vmulpd_avx512f(auVar10,auVar11);
          auVar11 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + uVar9),auVar11);
          *(undefined1 (*) [64])(pdVar6 + uVar9) = auVar11;
          uVar9 = uVar9 + 8;
        } while (uVar9 < uVar8);
      }
      if ((long)uVar8 < (long)uVar3) {
        do {
          pdVar6[uVar8] = pdVar4[uVar8] - local_68._0_8_ * (pdVar6[uVar8] + pdVar5[uVar8]);
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd);
      uVar3 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      if (uVar3 == (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows) {
        if (-1 < (long)uVar3) {
          pdVar4 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pdVar5 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          uVar8 = uVar3 & 0x7ffffffffffffff8;
          if (7 < uVar3) {
            auVar10 = vbroadcastsd_avx512f(local_68);
            uVar9 = 0;
            do {
              auVar11 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + uVar9),
                                       *(undefined1 (*) [64])(pdVar5 + uVar9));
              auVar11 = vdivpd_avx512f(auVar11,auVar10);
              *(undefined1 (*) [64])(pdVar5 + uVar9) = auVar11;
              uVar9 = uVar9 + 8;
            } while (uVar9 < uVar8);
          }
          if ((long)uVar8 < (long)uVar3) {
            do {
              pdVar5[uVar8] = (pdVar4[uVar8] - pdVar5[uVar8]) / local_68._0_8_;
              uVar8 = uVar8 + 1;
            } while (uVar3 != uVar8);
          }
          lVar7 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          if (lVar7 == 0) {
            auVar12 = ZEXT816(0) << 0x40;
          }
          else {
            local_50.m_xpr = pCVar1;
            if (lVar7 < 1) {
              __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                            "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                           );
            }
            local_40.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_double>
            .m_d.argImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                   (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
            auVar10._0_8_ =
                 Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                           (&local_40,&local_69,&local_50);
            auVar10._8_56_ = extraout_var;
            auVar12 = auVar10._0_16_;
          }
          auVar12 = vsqrtsd_avx(auVar12,auVar12);
          return auVar12._0_8_;
        }
        goto LAB_007bef02;
      }
      __function = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
    }
    else {
      __function = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>]"
      ;
    }
  }
  else {
    __function = 
    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
    ;
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
}

Assistant:

double ChSolverAPGD::Res4(ChSystemDescriptor& sysd) {
    // Project the gradient (for rollback strategy)
    // g_proj = (l-project_orthogonal(l - gdiff*g, fric))/gdiff;
    double gdiff = 1.0 / (nc * nc);
    sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew
    tmp = gammaNew - gdiff * (tmp + r);         // Note: no aliasing issues here
    sysd.ConstraintsProject(tmp);               // tmp = ProjectionOperator(gammaNew - gdiff * g)
    tmp = (gammaNew - tmp) / gdiff;             // Note: no aliasing issues here

    return tmp.norm();
}